

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_read.cpp
# Opt level: O3

int read_bin(string *str)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  undefined4 *puVar4;
  uint uVar5;
  ifstream bin;
  string local_268;
  string local_248;
  long local_228 [4];
  byte abStack_208 [488];
  
  std::ifstream::ifstream(local_228,(string *)str,_S_in|_S_bin);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
    pcVar1 = (str->_M_dataplus)._M_p;
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_268,pcVar1,pcVar1 + str->_M_string_length);
    GetPathOrURLShortName(&local_248,&local_268);
    std::__cxx11::string::operator=((string *)&FileName_abi_cxx11_,(string *)&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    lVar3 = std::__cxx11::string::rfind((char)str,0x5c);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)&local_248,(ulong)str);
      std::__cxx11::string::operator=((string *)&Directory_abi_cxx11_,(string *)&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_120dd,0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    std::istream::seekg((long)local_228,_S_beg);
    file_size = std::istream::tellg();
    std::istream::seekg((long)local_228,_S_beg);
    std::istream::read((char *)local_228,0x10a3e0);
    memcpy(stack_ptr + registe_ptr->SP,(str->_M_dataplus)._M_p,str->_M_string_length + 1);
    if (str->_M_string_length - 4 < 0xfffffffffffffffb) {
      iVar2 = (int)str->_M_string_length;
      uVar5 = iVar2 + 1;
      if ((uVar5 & 3) == 0) {
        registe_ptr->SP = (iVar2 + registe_ptr->SP) - 3;
      }
      else {
        registe_ptr->SP = registe_ptr->SP + (uVar5 & 0xfffffffc);
      }
    }
    std::ifstream::close();
    std::ifstream::~ifstream(local_228);
    return 1;
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0xf4;
  __cxa_throw(puVar4,&int::typeinfo,0);
}

Assistant:

int read_bin(std::string str) {
	ifstream bin(str, ios::in | ios::binary);
	
	if (bin) {
		FileName = GetPathOrURLShortName(str);
		const size_t last_slash_idx = str.rfind('\\');
		if (std::string::npos != last_slash_idx)
		{
			Directory = str.substr(0, last_slash_idx);
		}
		std::cout << "打开文件成功！" << std::endl;
		bin.seekg(0, ios::end);//移到文件尾部
		file_size = bin.tellg();//获取文件大小
		bin.seekg(0, ios::beg);//移到文件头部
		bin.read(origin_bin, file_size);
		int stack_offset;
		memcpy(stack_ptr + registe_ptr->SP, str.c_str(), str.length() + 1);//先写再加
		if (str.length() + 1 > 4) {
			if ((str.length() + 1) % 4 == 0) {//实际路径为取得长度+\x00
				stack_offset = str.length() +1;
				registe_ptr->SP += stack_offset;
				registe_ptr->SP -= 4;
			}
		else
		{
			stack_offset = 4 * ((str.length()+1) / 4) + 4;
			registe_ptr->SP += stack_offset;
			registe_ptr->SP -= 4;
		}
	}
	bin.close();
	return LVM_SUCCESS;
	}else throw(LVM_BIN_OPEN_ERROR);
}